

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransport_MQTT_Common_SendMessageDisposition
          (IOTHUB_DEVICE_HANDLE handle,IOTHUB_MESSAGE_HANDLE messageHandle,
          IOTHUBMESSAGE_DISPOSITION_RESULT disposition)

{
  IOTHUB_MESSAGE_RESULT IVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  LOGGER_LOG l_2;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  LOGGER_LOG l_1;
  MESSAGE_DISPOSITION_CONTEXT *msgDispCtx;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  IOTHUBMESSAGE_DISPOSITION_RESULT disposition_local;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  IOTHUB_DEVICE_HANDLE handle_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  l._4_4_ = disposition;
  _result = messageHandle;
  messageHandle_local = (IOTHUB_MESSAGE_HANDLE)handle;
  if ((handle == (IOTHUB_DEVICE_HANDLE)0x0) || (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0)) {
    msgDispCtx = (MESSAGE_DISPOSITION_CONTEXT *)xlogging_get_log_function();
    if (msgDispCtx != (MESSAGE_DISPOSITION_CONTEXT *)0x0) {
      (*(code *)msgDispCtx)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"IoTHubTransport_MQTT_Common_SendMessageDisposition",0xfa9,1,
                 "Invalid argument (handle=%p, messageHandle=%p",messageHandle_local,_result);
    }
    l._0_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    if ((disposition == IOTHUBMESSAGE_ACCEPTED) || (disposition == IOTHUBMESSAGE_REJECTED)) {
      l_1 = (LOGGER_LOG)0x0;
      IVar1 = IoTHubMessage_GetDispositionContext
                        (messageHandle,(MESSAGE_DISPOSITION_CONTEXT_HANDLE *)&l_1);
      if ((IVar1 == IOTHUB_MESSAGE_OK) && (l_1 != (LOGGER_LOG)0x0)) {
        iVar2 = mqtt_client_send_message_response
                          ((MQTT_CLIENT_HANDLE)messageHandle_local->userId,*(uint16_t *)l_1,
                           *(QOS_VALUE *)(l_1 + 4));
        if (iVar2 == 0) {
          l._0_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                      ,"IoTHubTransport_MQTT_Common_SendMessageDisposition",0xfbe,1,
                      "Failed sending ACK for MQTT message (packet_id=%u)",
                      CONCAT44(uVar4,(uint)*(ushort *)l_1));
          }
          l._0_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"IoTHubTransport_MQTT_Common_SendMessageDisposition",0xfb5,1,
                    "invalid message handle (no disposition context found)");
        }
        l._0_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
    else {
      l._0_4_ = IOTHUB_CLIENT_OK;
    }
    IoTHubMessage_Destroy(_result);
  }
  return (IOTHUB_CLIENT_RESULT)l;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_MQTT_Common_SendMessageDisposition(IOTHUB_DEVICE_HANDLE handle, IOTHUB_MESSAGE_HANDLE messageHandle, IOTHUBMESSAGE_DISPOSITION_RESULT disposition)
{
    IOTHUB_CLIENT_RESULT result;
    if (handle == NULL || messageHandle == NULL)
    {
        LogError("Invalid argument (handle=%p, messageHandle=%p", handle, messageHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        if (disposition == IOTHUBMESSAGE_ACCEPTED || disposition == IOTHUBMESSAGE_REJECTED)
        {
            MESSAGE_DISPOSITION_CONTEXT* msgDispCtx = NULL;

            if (IoTHubMessage_GetDispositionContext(messageHandle, &msgDispCtx) != IOTHUB_MESSAGE_OK ||
                msgDispCtx == NULL)
            {
                LogError("invalid message handle (no disposition context found)");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;

                if (mqtt_client_send_message_response(transport_data->mqttClient, msgDispCtx->packet_id, msgDispCtx->qos_value) != 0)
                {
                    LogError("Failed sending ACK for MQTT message (packet_id=%u)", msgDispCtx->packet_id);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }

        // This will also destroy the disposition context.
        IoTHubMessage_Destroy(messageHandle);
    }

    return result;
}